

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutMergeOrdered_(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  
  uVar4 = *(uint *)&pC0->field_0x1c;
  uVar10 = uVar4 >> 0x18;
  uVar8 = *(uint *)&pC1->field_0x1c;
  uVar12 = uVar8 >> 0x18;
  uVar3 = uVar4 >> 0x10 & 0xff;
  if ((uVar10 == uVar3) && (uVar12 == uVar3)) {
    if (0xffffff < uVar4) {
      uVar9 = 0;
      do {
        if ((&pC0[1].Area)[uVar9] != (&pC1[1].Area)[uVar9]) {
          return 0;
        }
        iVar1 = (int)uVar9;
        p->pPerm[2][uVar9] = iVar1;
        p->pPerm[1][uVar9] = iVar1;
        p->pPerm[0][uVar9] = iVar1;
        (&pC[1].Area)[uVar9] = (&pC0[1].Area)[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    cVar2 = (char)(uVar4 >> 0x10);
    pC->field_0x1f = cVar2;
    pC->uSign = pC1->uSign | pC0->uSign;
    p->uSharedMask = 0xffffffff >> (-cVar2 & 0x1fU);
    iVar1 = 1;
  }
  else {
    p->uSharedMask = 0;
    uVar14 = 0;
    uVar7 = 0;
    if (uVar4 < 0x1000000) {
LAB_0037ab19:
      iVar1 = 0;
      if ((int)(uVar7 + uVar12) <= (int)(uVar3 + uVar14)) {
        if ((int)uVar14 < (int)uVar12) {
          lVar11 = (long)(int)uVar14;
          lVar6 = 0;
          do {
            p->pPerm[1][lVar11 + lVar6] = uVar7 + (int)lVar6;
            (&pC[1].Area)[(int)uVar7 + lVar6] = (&pC1[1].Area)[lVar11 + lVar6];
            lVar6 = lVar6 + 1;
          } while ((ulong)uVar12 - lVar11 != lVar6);
          uVar7 = uVar7 + (int)lVar6;
        }
        pC->field_0x1f = (char)uVar7;
        pC->uSign = pC1->uSign | pC0->uSign;
        iVar1 = 1;
        if ((int)uVar7 < 1) {
          __assert_fail("c > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                        ,0x113,
                        "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)");
        }
      }
    }
    else {
      iVar1 = 0;
      uVar7 = 0;
      uVar4 = 0;
      if (uVar8 < 0x1000000) {
LAB_0037abc7:
        if ((int)(uVar7 + uVar10) <= (int)(uVar3 + uVar4)) {
          if ((int)uVar4 < (int)uVar10) {
            lVar11 = (long)(int)uVar4;
            lVar6 = 0;
            do {
              p->pPerm[0][lVar11 + lVar6] = uVar7 + (int)lVar6;
              (&pC[1].Area)[(int)uVar7 + lVar6] = (&pC0[1].Area)[lVar11 + lVar6];
              lVar6 = lVar6 + 1;
            } while ((ulong)uVar10 - lVar11 != lVar6);
            uVar7 = uVar7 + (int)lVar6;
          }
          pC->field_0x1f = (char)uVar7;
          pC->uSign = pC1->uSign | pC0->uSign;
          iVar1 = 1;
          if ((int)uVar7 < 1) {
            __assert_fail("c > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                          ,0x107,
                          "int If_CutMergeOrdered_(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *)")
            ;
          }
        }
      }
      else {
        if (uVar3 != 0) {
          iVar13 = 0;
          uVar14 = 0;
          uVar4 = 0;
          uVar8 = uVar7;
          do {
            if ((int)(&pC0[1].Area)[(int)uVar4] < (int)(&pC1[1].Area)[(int)uVar14]) {
              p->pPerm[0][(int)uVar4] = uVar8;
              uVar5 = uVar4 + 1;
              uVar7 = uVar8 + 1;
              (&pC[1].Area)[(int)uVar8] = (&pC0[1].Area)[(int)uVar4];
              uVar4 = uVar5;
              if (uVar5 == uVar10) goto LAB_0037ab19;
            }
            else if ((int)(&pC1[1].Area)[(int)uVar14] < (int)(&pC0[1].Area)[(int)uVar4]) {
              p->pPerm[1][(int)uVar14] = uVar8;
              uVar5 = uVar14 + 1;
              uVar7 = uVar8 + 1;
              (&pC[1].Area)[(int)uVar8] = (&pC1[1].Area)[(int)uVar14];
              uVar14 = uVar5;
              if (uVar5 == uVar12) goto LAB_0037abc7;
            }
            else {
              p->uSharedMask = p->uSharedMask | 1 << ((byte)uVar8 & 0x1f);
              p->pPerm[2][iVar13] = uVar8;
              p->pPerm[1][(int)uVar14] = uVar8;
              p->pPerm[0][(int)uVar4] = uVar8;
              uVar5 = uVar4 + 1;
              uVar7 = uVar8 + 1;
              (&pC[1].Area)[(int)uVar8] = (&pC0[1].Area)[(int)uVar4];
              uVar14 = uVar14 + 1;
              if (uVar5 == uVar10) goto LAB_0037ab19;
              uVar4 = uVar5;
              if (uVar14 == uVar12) goto LAB_0037abc7;
              iVar13 = iVar13 + 1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar3);
        }
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int If_CutMergeOrdered_( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            p->pPerm[0][i] = p->pPerm[1][i] = p->pPerm[2][i] = i;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        p->uSharedMask = Abc_InfoMask( nLimit );
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0;
    p->uSharedMask = 0;
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            p->pPerm[0][i] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            p->pPerm[1][k] = c;
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            p->uSharedMask |= (1 << c);
            p->pPerm[0][i] = p->pPerm[1][k] = p->pPerm[2][s++] = c;
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
    {
        p->pPerm[0][i] = c;
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
    {
        p->pPerm[1][k] = c;
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    }
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    assert( c > 0 );
    return 1;
}